

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rgbcx.h
# Opt level: O1

int rgbcx::init(EVP_PKEY_CTX *ctx)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  char cVar5;
  char cVar13;
  short sVar21;
  short sVar22;
  short sVar23;
  short sVar24;
  short sVar25;
  short sVar26;
  short sVar27;
  short sVar28;
  short sVar29;
  short sVar30;
  short sVar31;
  short sVar32;
  short sVar33;
  short sVar34;
  uint32_t i_1;
  long lVar35;
  float *pfVar36;
  uint32_t i;
  long lVar37;
  bc1_approx_mode mode;
  byte *pbVar38;
  uint uVar39;
  uint uVar40;
  uint uVar41;
  uint uVar42;
  uint uVar43;
  uint uVar44;
  uint uVar45;
  uint uVar46;
  uint uVar47;
  uint uVar48;
  uint uVar49;
  uint uVar50;
  uint uVar51;
  uint uVar52;
  uint uVar53;
  uint uVar54;
  uint uVar55;
  uint uVar56;
  uint uVar57;
  uint uVar58;
  uint uVar59;
  float fVar60;
  uint uVar61;
  uint uVar62;
  uint uVar63;
  uint uVar64;
  uint uVar65;
  uint uVar66;
  uint uVar67;
  uint uVar68;
  uint uVar70;
  uint uVar71;
  uint uVar72;
  undefined1 auVar69 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  short sVar75;
  float fVar77;
  undefined1 auVar81 [12];
  undefined1 auVar84 [16];
  undefined1 auVar86 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  short sVar90;
  undefined1 auVar95 [12];
  undefined1 auVar98 [16];
  undefined1 auVar100 [16];
  hist3 h;
  uint8_t bc1_expand5 [32];
  uint8_t bc1_expand6 [64];
  undefined2 local_8c;
  char local_8a;
  uint8_t local_88 [32];
  uint8_t local_68 [72];
  char cVar6;
  char cVar7;
  char cVar8;
  char cVar9;
  char cVar10;
  char cVar11;
  char cVar12;
  char cVar14;
  char cVar15;
  char cVar16;
  char cVar17;
  char cVar18;
  char cVar19;
  char cVar20;
  undefined4 uVar76;
  undefined6 uVar78;
  undefined8 uVar79;
  undefined1 auVar80 [12];
  undefined1 auVar82 [14];
  undefined1 auVar83 [14];
  undefined1 auVar85 [16];
  undefined1 auVar87 [16];
  undefined4 uVar91;
  undefined6 uVar92;
  undefined8 uVar93;
  undefined1 auVar94 [12];
  undefined1 auVar96 [14];
  undefined1 auVar97 [14];
  undefined1 auVar99 [16];
  undefined1 auVar101 [16];
  
  mode = (bc1_approx_mode)ctx;
  uVar39 = 0xc;
  uVar40 = 0xd;
  uVar41 = 0xe;
  uVar42 = 0xf;
  uVar43 = 8;
  uVar44 = 9;
  uVar45 = 10;
  uVar46 = 0xb;
  uVar47 = 4;
  uVar48 = 5;
  uVar49 = 6;
  uVar50 = 7;
  uVar51 = 0;
  uVar52 = 1;
  uVar53 = 2;
  uVar54 = 3;
  lVar35 = 0;
  uVar68 = uVar39;
  uVar70 = uVar40;
  uVar71 = uVar41;
  uVar72 = uVar42;
  uVar64 = uVar43;
  uVar65 = uVar44;
  uVar66 = uVar45;
  uVar67 = uVar46;
  uVar59 = uVar47;
  uVar61 = uVar48;
  uVar62 = uVar49;
  uVar63 = uVar50;
  uVar55 = uVar51;
  uVar56 = uVar52;
  uVar57 = uVar53;
  uVar58 = uVar54;
  do {
    auVar98._0_4_ = uVar55 * 8 + (uVar51 >> 2);
    auVar98._4_4_ = uVar56 * 8 + (uVar52 >> 2);
    auVar98._8_4_ = uVar57 * 8 + (uVar53 >> 2);
    auVar98._12_4_ = uVar58 * 8 + (uVar54 >> 2);
    auVar73._0_4_ = uVar59 * 8 + (uVar47 >> 2);
    auVar73._4_4_ = uVar61 * 8 + (uVar48 >> 2);
    auVar73._8_4_ = uVar62 * 8 + (uVar49 >> 2);
    auVar73._12_4_ = uVar63 * 8 + (uVar50 >> 2);
    auVar84._0_4_ = uVar64 * 8 + (uVar43 >> 2);
    auVar84._4_4_ = uVar65 * 8 + (uVar44 >> 2);
    auVar84._8_4_ = uVar66 * 8 + (uVar45 >> 2);
    auVar84._12_4_ = uVar67 * 8 + (uVar46 >> 2);
    auVar88._0_4_ = uVar68 * 8 + (uVar39 >> 2);
    auVar88._4_4_ = uVar70 * 8 + (uVar40 >> 2);
    auVar88._8_4_ = uVar71 * 8 + (uVar41 >> 2);
    auVar88._12_4_ = uVar72 * 8 + (uVar42 >> 2);
    auVar98 = auVar98 & _DAT_00121050;
    auVar73 = auVar73 & _DAT_00121050;
    sVar21 = auVar98._0_2_;
    cVar5 = (0 < sVar21) * (sVar21 < 0x100) * auVar98[0] - (0xff < sVar21);
    sVar21 = auVar98._2_2_;
    sVar90 = CONCAT11((0 < sVar21) * (sVar21 < 0x100) * auVar98[2] - (0xff < sVar21),cVar5);
    sVar21 = auVar98._4_2_;
    cVar6 = (0 < sVar21) * (sVar21 < 0x100) * auVar98[4] - (0xff < sVar21);
    sVar21 = auVar98._6_2_;
    uVar91 = CONCAT13((0 < sVar21) * (sVar21 < 0x100) * auVar98[6] - (0xff < sVar21),
                      CONCAT12(cVar6,sVar90));
    sVar21 = auVar98._8_2_;
    cVar7 = (0 < sVar21) * (sVar21 < 0x100) * auVar98[8] - (0xff < sVar21);
    sVar21 = auVar98._10_2_;
    uVar92 = CONCAT15((0 < sVar21) * (sVar21 < 0x100) * auVar98[10] - (0xff < sVar21),
                      CONCAT14(cVar7,uVar91));
    sVar21 = auVar98._12_2_;
    cVar8 = (0 < sVar21) * (sVar21 < 0x100) * auVar98[0xc] - (0xff < sVar21);
    sVar21 = auVar98._14_2_;
    uVar93 = CONCAT17((0 < sVar21) * (sVar21 < 0x100) * auVar98[0xe] - (0xff < sVar21),
                      CONCAT16(cVar8,uVar92));
    sVar21 = auVar73._0_2_;
    cVar9 = (0 < sVar21) * (sVar21 < 0x100) * auVar73[0] - (0xff < sVar21);
    sVar21 = auVar73._2_2_;
    auVar94._0_10_ =
         CONCAT19((0 < sVar21) * (sVar21 < 0x100) * auVar73[2] - (0xff < sVar21),
                  CONCAT18(cVar9,uVar93));
    sVar21 = auVar73._4_2_;
    cVar10 = (0 < sVar21) * (sVar21 < 0x100) * auVar73[4] - (0xff < sVar21);
    auVar94[10] = cVar10;
    sVar21 = auVar73._6_2_;
    auVar94[0xb] = (0 < sVar21) * (sVar21 < 0x100) * auVar73[6] - (0xff < sVar21);
    sVar21 = auVar73._8_2_;
    cVar11 = (0 < sVar21) * (sVar21 < 0x100) * auVar73[8] - (0xff < sVar21);
    auVar96[0xc] = cVar11;
    auVar96._0_12_ = auVar94;
    sVar21 = auVar73._10_2_;
    auVar96[0xd] = (0 < sVar21) * (sVar21 < 0x100) * auVar73[10] - (0xff < sVar21);
    sVar21 = auVar73._12_2_;
    cVar12 = (0 < sVar21) * (sVar21 < 0x100) * auVar73[0xc] - (0xff < sVar21);
    auVar99[0xe] = cVar12;
    auVar99._0_14_ = auVar96;
    sVar21 = auVar73._14_2_;
    auVar99[0xf] = (0 < sVar21) * (sVar21 < 0x100) * auVar73[0xe] - (0xff < sVar21);
    auVar84 = auVar84 & _DAT_00121050;
    auVar88 = auVar88 & _DAT_00121050;
    sVar21 = auVar84._0_2_;
    cVar13 = (0 < sVar21) * (sVar21 < 0x100) * auVar84[0] - (0xff < sVar21);
    sVar21 = auVar84._2_2_;
    sVar75 = CONCAT11((0 < sVar21) * (sVar21 < 0x100) * auVar84[2] - (0xff < sVar21),cVar13);
    sVar21 = auVar84._4_2_;
    cVar14 = (0 < sVar21) * (sVar21 < 0x100) * auVar84[4] - (0xff < sVar21);
    sVar21 = auVar84._6_2_;
    uVar76 = CONCAT13((0 < sVar21) * (sVar21 < 0x100) * auVar84[6] - (0xff < sVar21),
                      CONCAT12(cVar14,sVar75));
    sVar21 = auVar84._8_2_;
    cVar15 = (0 < sVar21) * (sVar21 < 0x100) * auVar84[8] - (0xff < sVar21);
    sVar21 = auVar84._10_2_;
    uVar78 = CONCAT15((0 < sVar21) * (sVar21 < 0x100) * auVar84[10] - (0xff < sVar21),
                      CONCAT14(cVar15,uVar76));
    sVar21 = auVar84._12_2_;
    cVar16 = (0 < sVar21) * (sVar21 < 0x100) * auVar84[0xc] - (0xff < sVar21);
    sVar21 = auVar84._14_2_;
    uVar79 = CONCAT17((0 < sVar21) * (sVar21 < 0x100) * auVar84[0xe] - (0xff < sVar21),
                      CONCAT16(cVar16,uVar78));
    sVar21 = auVar88._0_2_;
    cVar17 = (0 < sVar21) * (sVar21 < 0x100) * auVar88[0] - (0xff < sVar21);
    sVar21 = auVar88._2_2_;
    auVar80._0_10_ =
         CONCAT19((0 < sVar21) * (sVar21 < 0x100) * auVar88[2] - (0xff < sVar21),
                  CONCAT18(cVar17,uVar79));
    sVar21 = auVar88._4_2_;
    cVar18 = (0 < sVar21) * (sVar21 < 0x100) * auVar88[4] - (0xff < sVar21);
    auVar80[10] = cVar18;
    sVar21 = auVar88._6_2_;
    auVar80[0xb] = (0 < sVar21) * (sVar21 < 0x100) * auVar88[6] - (0xff < sVar21);
    sVar21 = auVar88._8_2_;
    cVar19 = (0 < sVar21) * (sVar21 < 0x100) * auVar88[8] - (0xff < sVar21);
    auVar82[0xc] = cVar19;
    auVar82._0_12_ = auVar80;
    sVar21 = auVar88._10_2_;
    auVar82[0xd] = (0 < sVar21) * (sVar21 < 0x100) * auVar88[10] - (0xff < sVar21);
    sVar21 = auVar88._12_2_;
    cVar20 = (0 < sVar21) * (sVar21 < 0x100) * auVar88[0xc] - (0xff < sVar21);
    auVar85[0xe] = cVar20;
    auVar85._0_14_ = auVar82;
    sVar21 = auVar88._14_2_;
    auVar85[0xf] = (0 < sVar21) * (sVar21 < 0x100) * auVar88[0xe] - (0xff < sVar21);
    sVar21 = (short)((uint)uVar91 >> 0x10);
    sVar22 = (short)((uint6)uVar92 >> 0x20);
    sVar23 = (short)((ulong)uVar93 >> 0x30);
    sVar24 = (short)((unkuint10)auVar94._0_10_ >> 0x40);
    sVar25 = auVar94._10_2_;
    sVar26 = auVar96._12_2_;
    sVar27 = auVar99._14_2_;
    sVar28 = (short)((uint)uVar76 >> 0x10);
    sVar29 = (short)((uint6)uVar78 >> 0x20);
    sVar30 = (short)((ulong)uVar79 >> 0x30);
    sVar31 = (short)((unkuint10)auVar80._0_10_ >> 0x40);
    sVar32 = auVar80._10_2_;
    sVar33 = auVar82._12_2_;
    sVar34 = auVar85._14_2_;
    local_88[lVar35] = (0 < sVar90) * (sVar90 < 0x100) * cVar5 - (0xff < sVar90);
    local_88[lVar35 + 1] = (0 < sVar21) * (sVar21 < 0x100) * cVar6 - (0xff < sVar21);
    local_88[lVar35 + 2] = (0 < sVar22) * (sVar22 < 0x100) * cVar7 - (0xff < sVar22);
    local_88[lVar35 + 3] = (0 < sVar23) * (sVar23 < 0x100) * cVar8 - (0xff < sVar23);
    local_88[lVar35 + 4] = (0 < sVar24) * (sVar24 < 0x100) * cVar9 - (0xff < sVar24);
    local_88[lVar35 + 5] = (0 < sVar25) * (sVar25 < 0x100) * cVar10 - (0xff < sVar25);
    local_88[lVar35 + 6] = (0 < sVar26) * (sVar26 < 0x100) * cVar11 - (0xff < sVar26);
    local_88[lVar35 + 7] = (0 < sVar27) * (sVar27 < 0x100) * cVar12 - (0xff < sVar27);
    local_88[lVar35 + 8] = (0 < sVar75) * (sVar75 < 0x100) * cVar13 - (0xff < sVar75);
    local_88[lVar35 + 9] = (0 < sVar28) * (sVar28 < 0x100) * cVar14 - (0xff < sVar28);
    local_88[lVar35 + 10] = (0 < sVar29) * (sVar29 < 0x100) * cVar15 - (0xff < sVar29);
    local_88[lVar35 + 0xb] = (0 < sVar30) * (sVar30 < 0x100) * cVar16 - (0xff < sVar30);
    local_88[lVar35 + 0xc] = (0 < sVar31) * (sVar31 < 0x100) * cVar17 - (0xff < sVar31);
    local_88[lVar35 + 0xd] = (0 < sVar32) * (sVar32 < 0x100) * cVar18 - (0xff < sVar32);
    local_88[lVar35 + 0xe] = (0 < sVar33) * (sVar33 < 0x100) * cVar19 - (0xff < sVar33);
    local_88[lVar35 + 0xf] = (0 < sVar34) * (sVar34 < 0x100) * cVar20 - (0xff < sVar34);
    lVar35 = lVar35 + 0x10;
    uVar51 = uVar51 + 0x10;
    uVar52 = uVar52 + 0x10;
    uVar53 = uVar53 + 0x10;
    uVar54 = uVar54 + 0x10;
    uVar47 = uVar47 + 0x10;
    uVar48 = uVar48 + 0x10;
    uVar49 = uVar49 + 0x10;
    uVar50 = uVar50 + 0x10;
    uVar43 = uVar43 + 0x10;
    uVar44 = uVar44 + 0x10;
    uVar45 = uVar45 + 0x10;
    uVar46 = uVar46 + 0x10;
    uVar39 = uVar39 + 0x10;
    uVar40 = uVar40 + 0x10;
    uVar41 = uVar41 + 0x10;
    uVar42 = uVar42 + 0x10;
    uVar55 = uVar55 + 0x10;
    uVar56 = uVar56 + 0x10;
    uVar57 = uVar57 + 0x10;
    uVar58 = uVar58 + 0x10;
    uVar59 = uVar59 + 0x10;
    uVar61 = uVar61 + 0x10;
    uVar62 = uVar62 + 0x10;
    uVar63 = uVar63 + 0x10;
    uVar64 = uVar64 + 0x10;
    uVar65 = uVar65 + 0x10;
    uVar66 = uVar66 + 0x10;
    uVar67 = uVar67 + 0x10;
    uVar68 = uVar68 + 0x10;
    uVar70 = uVar70 + 0x10;
    uVar71 = uVar71 + 0x10;
    uVar72 = uVar72 + 0x10;
  } while (lVar35 != 0x20);
  g_bc1_approx_mode = mode;
  prepare_bc1_single_color_table((bc1_match_entry *)g_bc1_match5_equals_1,local_88,0x20,mode);
  prepare_bc1_single_color_table_half((bc1_match_entry *)g_bc1_match5_half,local_88,0x20,mode);
  uVar39 = 0xc;
  uVar40 = 0xd;
  uVar41 = 0xe;
  uVar42 = 0xf;
  uVar43 = 8;
  uVar44 = 9;
  uVar45 = 10;
  uVar46 = 0xb;
  uVar47 = 4;
  uVar48 = 5;
  uVar49 = 6;
  uVar50 = 7;
  uVar51 = 0;
  uVar52 = 1;
  uVar53 = 2;
  uVar54 = 3;
  lVar35 = 0;
  uVar68 = uVar39;
  uVar70 = uVar40;
  uVar71 = uVar41;
  uVar72 = uVar42;
  uVar64 = uVar43;
  uVar65 = uVar44;
  uVar66 = uVar45;
  uVar67 = uVar46;
  uVar59 = uVar47;
  uVar61 = uVar48;
  uVar62 = uVar49;
  uVar63 = uVar50;
  uVar55 = uVar51;
  uVar56 = uVar52;
  uVar57 = uVar53;
  uVar58 = uVar54;
  do {
    auVar100._0_4_ = uVar55 * 4 + (uVar51 >> 4);
    auVar100._4_4_ = uVar56 * 4 + (uVar52 >> 4);
    auVar100._8_4_ = uVar57 * 4 + (uVar53 >> 4);
    auVar100._12_4_ = uVar58 * 4 + (uVar54 >> 4);
    auVar74._0_4_ = uVar59 * 4 + (uVar47 >> 4);
    auVar74._4_4_ = uVar61 * 4 + (uVar48 >> 4);
    auVar74._8_4_ = uVar62 * 4 + (uVar49 >> 4);
    auVar74._12_4_ = uVar63 * 4 + (uVar50 >> 4);
    auVar86._0_4_ = uVar64 * 4 + (uVar43 >> 4);
    auVar86._4_4_ = uVar65 * 4 + (uVar44 >> 4);
    auVar86._8_4_ = uVar66 * 4 + (uVar45 >> 4);
    auVar86._12_4_ = uVar67 * 4 + (uVar46 >> 4);
    auVar89._0_4_ = uVar68 * 4 + (uVar39 >> 4);
    auVar89._4_4_ = uVar70 * 4 + (uVar40 >> 4);
    auVar89._8_4_ = uVar71 * 4 + (uVar41 >> 4);
    auVar89._12_4_ = uVar72 * 4 + (uVar42 >> 4);
    auVar100 = auVar100 & _DAT_00121050;
    auVar74 = auVar74 & _DAT_00121050;
    sVar21 = auVar100._0_2_;
    cVar6 = (0 < sVar21) * (sVar21 < 0x100) * auVar100[0] - (0xff < sVar21);
    sVar21 = auVar100._2_2_;
    sVar90 = CONCAT11((0 < sVar21) * (sVar21 < 0x100) * auVar100[2] - (0xff < sVar21),cVar6);
    sVar21 = auVar100._4_2_;
    cVar5 = (0 < sVar21) * (sVar21 < 0x100) * auVar100[4] - (0xff < sVar21);
    sVar21 = auVar100._6_2_;
    uVar91 = CONCAT13((0 < sVar21) * (sVar21 < 0x100) * auVar100[6] - (0xff < sVar21),
                      CONCAT12(cVar5,sVar90));
    sVar21 = auVar100._8_2_;
    cVar12 = (0 < sVar21) * (sVar21 < 0x100) * auVar100[8] - (0xff < sVar21);
    sVar21 = auVar100._10_2_;
    uVar92 = CONCAT15((0 < sVar21) * (sVar21 < 0x100) * auVar100[10] - (0xff < sVar21),
                      CONCAT14(cVar12,uVar91));
    sVar21 = auVar100._12_2_;
    cVar11 = (0 < sVar21) * (sVar21 < 0x100) * auVar100[0xc] - (0xff < sVar21);
    sVar21 = auVar100._14_2_;
    uVar93 = CONCAT17((0 < sVar21) * (sVar21 < 0x100) * auVar100[0xe] - (0xff < sVar21),
                      CONCAT16(cVar11,uVar92));
    sVar21 = auVar74._0_2_;
    cVar10 = (0 < sVar21) * (sVar21 < 0x100) * auVar74[0] - (0xff < sVar21);
    sVar21 = auVar74._2_2_;
    auVar95._0_10_ =
         CONCAT19((0 < sVar21) * (sVar21 < 0x100) * auVar74[2] - (0xff < sVar21),
                  CONCAT18(cVar10,uVar93));
    sVar21 = auVar74._4_2_;
    cVar9 = (0 < sVar21) * (sVar21 < 0x100) * auVar74[4] - (0xff < sVar21);
    auVar95[10] = cVar9;
    sVar21 = auVar74._6_2_;
    auVar95[0xb] = (0 < sVar21) * (sVar21 < 0x100) * auVar74[6] - (0xff < sVar21);
    sVar21 = auVar74._8_2_;
    cVar8 = (0 < sVar21) * (sVar21 < 0x100) * auVar74[8] - (0xff < sVar21);
    auVar97[0xc] = cVar8;
    auVar97._0_12_ = auVar95;
    sVar21 = auVar74._10_2_;
    auVar97[0xd] = (0 < sVar21) * (sVar21 < 0x100) * auVar74[10] - (0xff < sVar21);
    sVar21 = auVar74._12_2_;
    cVar7 = (0 < sVar21) * (sVar21 < 0x100) * auVar74[0xc] - (0xff < sVar21);
    auVar101[0xe] = cVar7;
    auVar101._0_14_ = auVar97;
    sVar21 = auVar74._14_2_;
    auVar101[0xf] = (0 < sVar21) * (sVar21 < 0x100) * auVar74[0xe] - (0xff < sVar21);
    auVar86 = auVar86 & _DAT_00121050;
    auVar89 = auVar89 & _DAT_00121050;
    sVar21 = auVar86._0_2_;
    cVar15 = (0 < sVar21) * (sVar21 < 0x100) * auVar86[0] - (0xff < sVar21);
    sVar21 = auVar86._2_2_;
    sVar75 = CONCAT11((0 < sVar21) * (sVar21 < 0x100) * auVar86[2] - (0xff < sVar21),cVar15);
    sVar21 = auVar86._4_2_;
    cVar20 = (0 < sVar21) * (sVar21 < 0x100) * auVar86[4] - (0xff < sVar21);
    sVar21 = auVar86._6_2_;
    uVar76 = CONCAT13((0 < sVar21) * (sVar21 < 0x100) * auVar86[6] - (0xff < sVar21),
                      CONCAT12(cVar20,sVar75));
    sVar21 = auVar86._8_2_;
    cVar19 = (0 < sVar21) * (sVar21 < 0x100) * auVar86[8] - (0xff < sVar21);
    sVar21 = auVar86._10_2_;
    uVar78 = CONCAT15((0 < sVar21) * (sVar21 < 0x100) * auVar86[10] - (0xff < sVar21),
                      CONCAT14(cVar19,uVar76));
    sVar21 = auVar86._12_2_;
    cVar18 = (0 < sVar21) * (sVar21 < 0x100) * auVar86[0xc] - (0xff < sVar21);
    sVar21 = auVar86._14_2_;
    uVar79 = CONCAT17((0 < sVar21) * (sVar21 < 0x100) * auVar86[0xe] - (0xff < sVar21),
                      CONCAT16(cVar18,uVar78));
    sVar21 = auVar89._0_2_;
    cVar17 = (0 < sVar21) * (sVar21 < 0x100) * auVar89[0] - (0xff < sVar21);
    sVar21 = auVar89._2_2_;
    auVar81._0_10_ =
         CONCAT19((0 < sVar21) * (sVar21 < 0x100) * auVar89[2] - (0xff < sVar21),
                  CONCAT18(cVar17,uVar79));
    sVar21 = auVar89._4_2_;
    cVar16 = (0 < sVar21) * (sVar21 < 0x100) * auVar89[4] - (0xff < sVar21);
    auVar81[10] = cVar16;
    sVar21 = auVar89._6_2_;
    auVar81[0xb] = (0 < sVar21) * (sVar21 < 0x100) * auVar89[6] - (0xff < sVar21);
    sVar21 = auVar89._8_2_;
    cVar14 = (0 < sVar21) * (sVar21 < 0x100) * auVar89[8] - (0xff < sVar21);
    auVar83[0xc] = cVar14;
    auVar83._0_12_ = auVar81;
    sVar21 = auVar89._10_2_;
    auVar83[0xd] = (0 < sVar21) * (sVar21 < 0x100) * auVar89[10] - (0xff < sVar21);
    sVar21 = auVar89._12_2_;
    cVar13 = (0 < sVar21) * (sVar21 < 0x100) * auVar89[0xc] - (0xff < sVar21);
    auVar87[0xe] = cVar13;
    auVar87._0_14_ = auVar83;
    sVar21 = auVar89._14_2_;
    auVar87[0xf] = (0 < sVar21) * (sVar21 < 0x100) * auVar89[0xe] - (0xff < sVar21);
    sVar21 = (short)((uint)uVar91 >> 0x10);
    sVar22 = (short)((uint6)uVar92 >> 0x20);
    sVar23 = (short)((ulong)uVar93 >> 0x30);
    sVar24 = (short)((unkuint10)auVar95._0_10_ >> 0x40);
    sVar25 = auVar95._10_2_;
    sVar26 = auVar97._12_2_;
    sVar27 = auVar101._14_2_;
    sVar28 = (short)((uint)uVar76 >> 0x10);
    sVar29 = (short)((uint6)uVar78 >> 0x20);
    sVar30 = (short)((ulong)uVar79 >> 0x30);
    sVar31 = (short)((unkuint10)auVar81._0_10_ >> 0x40);
    sVar32 = auVar81._10_2_;
    sVar33 = auVar83._12_2_;
    sVar34 = auVar87._14_2_;
    local_68[lVar35] = (0 < sVar90) * (sVar90 < 0x100) * cVar6 - (0xff < sVar90);
    local_68[lVar35 + 1] = (0 < sVar21) * (sVar21 < 0x100) * cVar5 - (0xff < sVar21);
    local_68[lVar35 + 2] = (0 < sVar22) * (sVar22 < 0x100) * cVar12 - (0xff < sVar22);
    local_68[lVar35 + 3] = (0 < sVar23) * (sVar23 < 0x100) * cVar11 - (0xff < sVar23);
    local_68[lVar35 + 4] = (0 < sVar24) * (sVar24 < 0x100) * cVar10 - (0xff < sVar24);
    local_68[lVar35 + 5] = (0 < sVar25) * (sVar25 < 0x100) * cVar9 - (0xff < sVar25);
    local_68[lVar35 + 6] = (0 < sVar26) * (sVar26 < 0x100) * cVar8 - (0xff < sVar26);
    local_68[lVar35 + 7] = (0 < sVar27) * (sVar27 < 0x100) * cVar7 - (0xff < sVar27);
    local_68[lVar35 + 8] = (0 < sVar75) * (sVar75 < 0x100) * cVar15 - (0xff < sVar75);
    local_68[lVar35 + 9] = (0 < sVar28) * (sVar28 < 0x100) * cVar20 - (0xff < sVar28);
    local_68[lVar35 + 10] = (0 < sVar29) * (sVar29 < 0x100) * cVar19 - (0xff < sVar29);
    local_68[lVar35 + 0xb] = (0 < sVar30) * (sVar30 < 0x100) * cVar18 - (0xff < sVar30);
    local_68[lVar35 + 0xc] = (0 < sVar31) * (sVar31 < 0x100) * cVar17 - (0xff < sVar31);
    local_68[lVar35 + 0xd] = (0 < sVar32) * (sVar32 < 0x100) * cVar16 - (0xff < sVar32);
    local_68[lVar35 + 0xe] = (0 < sVar33) * (sVar33 < 0x100) * cVar14 - (0xff < sVar33);
    local_68[lVar35 + 0xf] = (0 < sVar34) * (sVar34 < 0x100) * cVar13 - (0xff < sVar34);
    lVar35 = lVar35 + 0x10;
    uVar51 = uVar51 + 0x10;
    uVar52 = uVar52 + 0x10;
    uVar53 = uVar53 + 0x10;
    uVar54 = uVar54 + 0x10;
    uVar47 = uVar47 + 0x10;
    uVar48 = uVar48 + 0x10;
    uVar49 = uVar49 + 0x10;
    uVar50 = uVar50 + 0x10;
    uVar43 = uVar43 + 0x10;
    uVar44 = uVar44 + 0x10;
    uVar45 = uVar45 + 0x10;
    uVar46 = uVar46 + 0x10;
    uVar39 = uVar39 + 0x10;
    uVar40 = uVar40 + 0x10;
    uVar41 = uVar41 + 0x10;
    uVar42 = uVar42 + 0x10;
    uVar55 = uVar55 + 0x10;
    uVar56 = uVar56 + 0x10;
    uVar57 = uVar57 + 0x10;
    uVar58 = uVar58 + 0x10;
    uVar59 = uVar59 + 0x10;
    uVar61 = uVar61 + 0x10;
    uVar62 = uVar62 + 0x10;
    uVar63 = uVar63 + 0x10;
    uVar64 = uVar64 + 0x10;
    uVar65 = uVar65 + 0x10;
    uVar66 = uVar66 + 0x10;
    uVar67 = uVar67 + 0x10;
    uVar68 = uVar68 + 0x10;
    uVar70 = uVar70 + 0x10;
    uVar71 = uVar71 + 0x10;
    uVar72 = uVar72 + 0x10;
  } while (lVar35 != 0x40);
  prepare_bc1_single_color_table((bc1_match_entry *)g_bc1_match6_equals_1,local_68,0x40,mode);
  prepare_bc1_single_color_table_half((bc1_match_entry *)g_bc1_match6_half,local_68,0x40,mode);
  pfVar36 = (float *)&DAT_0016d598;
  lVar35 = 0;
  do {
    bVar1 = (&g_unique_total_orders4)[lVar35 * 4];
    bVar2 = (&DAT_00124411)[lVar35 * 4];
    bVar3 = (&DAT_00124412)[lVar35 * 4];
    bVar4 = (&DAT_00124413)[lVar35 * 4];
    if ((((bVar1 != 0x10) && (bVar2 != 0x10)) && (bVar3 != 0x10)) && (bVar4 != 0x10)) {
      *(short *)(g_total_ordering4_hash +
                ((uint)bVar3 << 9 | (uint)bVar2 << 5 | (uint)bVar1 + (uint)bVar1)) = (short)lVar35;
    }
    auVar69._8_4_ = 0x90000;
    auVar69._0_8_ = 0x1020400010204;
    auVar69._12_4_ = 0x90000;
    uVar70 = (int)((auVar69._8_8_ & 0xffffffff) * (ulong)bVar4) + (uint)bVar2 * 0x10204 +
             (uint)bVar3 * 0x40201 + (uint)bVar1 * 9;
    fVar60 = (float)(uVar70 >> 0x10 & 0xff);
    uVar68 = uVar70 >> 8 & 0xff;
    fVar77 = fVar60 * (float)(uVar70 & 0xff) - (float)(uVar68 * uVar68);
    fVar77 = (float)(~-(uint)(ABS(fVar77) < 1e-08) & (uint)(0.011764706 / fVar77));
    *(ulong *)(pfVar36 + -2) = CONCAT44(-(float)uVar68 * fVar77,(float)(uVar70 & 0xff) * fVar77);
    *pfVar36 = fVar77 * fVar60;
    lVar35 = lVar35 + 1;
    pfVar36 = pfVar36 + 3;
  } while (lVar35 != 0x3c9);
  lVar35 = 0;
  do {
    lVar37 = lVar35 * 3;
    bVar1 = (&g_unique_total_orders3)[lVar37];
    local_8c = *(undefined2 *)(&g_unique_total_orders3 + lVar37);
    local_8a = (&DAT_00125342)[lVar37];
    if ((&DAT_00125342)[lVar37] != '\x10' && ((&DAT_00125341)[lVar37] != 0x10 && bVar1 != 0x10)) {
      *(short *)(g_total_ordering3_hash +
                ((uint)(byte)(&DAT_00125341)[lVar37] << 5 | (uint)bVar1 * 2)) = (short)lVar35;
    }
    lVar37 = 0;
    uVar68 = 0;
    pbVar38 = (byte *)&local_8c;
    do {
      uVar68 = uVar68 + (uint)*pbVar38 * *(int *)((long)&g_weight_vals3 + lVar37);
      lVar37 = lVar37 + 4;
      pbVar38 = pbVar38 + 1;
    } while (lVar37 != 0xc);
    fVar60 = (float)(uVar68 >> 0x10 & 0xff);
    uVar70 = uVar68 >> 8 & 0xff;
    fVar77 = fVar60 * (float)(uVar68 & 0xff) - (float)(uVar70 * uVar70);
    fVar77 = (float)(~-(uint)(ABS(fVar77) < 1e-08) & (uint)(0.007843138 / fVar77));
    *(ulong *)((long)&g_selector_factors3 + lVar35 * 0xc) =
         CONCAT44(-(float)uVar70 * fVar77,(float)(uVar68 & 0xff) * fVar77);
    (&DAT_00170508)[lVar35 * 3] = fVar77 * fVar60;
    lVar35 = lVar35 + 1;
  } while (lVar35 != 0x99);
  return 0x99;
}

Assistant:

void init(bc1_approx_mode mode)
	{
		g_bc1_approx_mode = mode;
								
		uint8_t bc1_expand5[32];
		for (int i = 0; i < 32; i++)
			bc1_expand5[i] = static_cast<uint8_t>((i << 3) | (i >> 2));
		prepare_bc1_single_color_table(g_bc1_match5_equals_1, bc1_expand5, 32, mode);
		prepare_bc1_single_color_table_half(g_bc1_match5_half, bc1_expand5, 32, mode);

		uint8_t bc1_expand6[64];
		for (int i = 0; i < 64; i++)
			bc1_expand6[i] = static_cast<uint8_t>((i << 2) | (i >> 4));
		prepare_bc1_single_color_table(g_bc1_match6_equals_1, bc1_expand6, 64, mode);
		prepare_bc1_single_color_table_half(g_bc1_match6_half, bc1_expand6, 64, mode);

		for (uint32_t i = 0; i < NUM_UNIQUE_TOTAL_ORDERINGS4; i++)
		{
			hist4 h;
			h.m_hist[0] = (uint8_t)g_unique_total_orders4[i][0];
			h.m_hist[1] = (uint8_t)g_unique_total_orders4[i][1];
			h.m_hist[2] = (uint8_t)g_unique_total_orders4[i][2];
			h.m_hist[3] = (uint8_t)g_unique_total_orders4[i][3];
			
			if (!h.any_16())
			{
				const uint32_t index = h.m_hist[0] | (h.m_hist[1] << 4) | (h.m_hist[2] << 8);
				assert(index < 4096);
				g_total_ordering4_hash[index] = (uint16_t)i;
			}

			compute_selector_factors4(h, g_selector_factors4[i][0], g_selector_factors4[i][1], g_selector_factors4[i][2]);
		}

		for (uint32_t i = 0; i < NUM_UNIQUE_TOTAL_ORDERINGS3; i++)
		{
			hist3 h;
			h.m_hist[0] = (uint8_t)g_unique_total_orders3[i][0];
			h.m_hist[1] = (uint8_t)g_unique_total_orders3[i][1];
			h.m_hist[2] = (uint8_t)g_unique_total_orders3[i][2];
			
			if (!h.any_16())
			{
				const uint32_t index = h.m_hist[0] | (h.m_hist[1] << 4);
				assert(index < 256);
				g_total_ordering3_hash[index] = (uint16_t)i;
			}

			compute_selector_factors3(h, g_selector_factors3[i][0], g_selector_factors3[i][1], g_selector_factors3[i][2]);
		}

		g_initialized = true;
	}